

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

VarName * __thiscall Parser::parseVarName(Parser *this)

{
  FILE *__stream;
  string *__str;
  VarName *this_00;
  TokenType type;
  string temp;
  string local_38;
  
  __str = Token::getValue_abi_cxx11_(this->currentToken);
  std::__cxx11::string::string((string *)&temp,__str);
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_38,(Token *)0x10,type);
  fprintf(__stream,"\x1b[32m\tParsing [%s] \'%s\'\n\x1b[0m",local_38._M_dataplus._M_p,
          temp._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  loadNextToken(this);
  this_00 = (VarName *)operator_new(0x28);
  VarName::VarName(this_00,&temp);
  std::__cxx11::string::~string((string *)&temp);
  return this_00;
}

Assistant:

VarName *Parser::parseVarName() {
    // Store temp value
    std::string temp = currentToken->getValue();

    // Debug output
    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [%s] \'%s\'\n" ANSI_COLOR_RESET,
                Token::tokenDesc(TokenType::VarToken).data(), temp.data());
    }

    // Prep next token
    loadNextToken();

    return new VarName(temp);
}